

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::UninterpretedOption_NamePart::MergePartialFromCodedStream
          (UninterpretedOption_NamePart *this,CodedInputStream *input)

{
  ArenaStringPtr *this_00;
  byte bVar1;
  uint8 uVar2;
  byte *pbVar3;
  uint8 *puVar4;
  void *pvVar5;
  bool bVar6;
  uint32 uVar7;
  uint uVar8;
  int iVar9;
  UnknownFieldSet *unknown_fields;
  uint tag;
  ulong uVar10;
  pair<unsigned_long,_bool> pVar11;
  
  this_00 = &this->name_part_;
  do {
    pbVar3 = input->buffer_;
    uVar7 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar7 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003d1d1a;
      input->buffer_ = pbVar3 + 1;
      uVar10 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003d1d1a:
      uVar7 = io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar10 = 0;
      if (uVar7 - 1 < 0x7f) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar7 | uVar10;
    }
    tag = (uint)uVar10;
    if ((uVar10 & 0x100000000) == 0) {
LAB_003d1dd4:
      iVar9 = 7;
      if ((tag & 7) != 4 && tag != 0) {
        pvVar5 = (this->_internal_metadata_).
                 super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 .ptr_;
        if (((ulong)pvVar5 & 1) == 0) {
          unknown_fields =
               internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
        }
        else {
          unknown_fields = (UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe);
        }
        bVar6 = internal::WireFormat::SkipField(input,tag,unknown_fields);
        iVar9 = 6;
        if (bVar6) goto LAB_003d1e09;
      }
    }
    else {
      uVar8 = (uint)(uVar10 >> 3) & 0x1fffffff;
      if (uVar8 == 2) {
        if ((char)uVar10 != '\x10') goto LAB_003d1dd4;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (uVar2 = *puVar4, -1 < (long)(char)uVar2)) {
          input->buffer_ = puVar4 + 1;
          pVar11._8_8_ = 1;
          pVar11.first = (long)(char)uVar2;
        }
        else {
          pVar11 = io::CodedInputStream::ReadVarint64Fallback(input);
        }
        iVar9 = 6;
        if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          this->is_extension_ = pVar11.first != 0;
          goto LAB_003d1e09;
        }
      }
      else {
        if ((uVar8 != 1) || ((char)uVar10 != '\n')) goto LAB_003d1dd4;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        if ((this->name_part_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_00,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
        bVar6 = internal::WireFormatLite::ReadBytes(input,this_00->ptr_);
        iVar9 = 6;
        if (!bVar6) goto LAB_003d1e0b;
        internal::WireFormatLite::VerifyUtf8String
                  ((this_00->ptr_->_M_dataplus)._M_p,(int)this_00->ptr_->_M_string_length,PARSE,
                   "google.protobuf.UninterpretedOption.NamePart.name_part");
LAB_003d1e09:
        iVar9 = 0;
      }
    }
LAB_003d1e0b:
    if (iVar9 != 0) {
      return iVar9 != 6;
    }
  } while( true );
}

Assistant:

bool UninterpretedOption_NamePart::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.UninterpretedOption.NamePart)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // required string name_part = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name_part()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->name_part().data(), this->name_part().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.UninterpretedOption.NamePart.name_part");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // required bool is_extension = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_is_extension();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &is_extension_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.UninterpretedOption.NamePart)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.UninterpretedOption.NamePart)
  return false;
#undef DO_
}